

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O3

ostream * operator<<(ostream *out,LUPMatrix *lup_matrix)

{
  string local_30;
  
  if (Options::output_type == 1) {
    LUPMatrix::ToLaTex_abi_cxx11_(&local_30,lup_matrix);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    LUPMatrix::ToString_abi_cxx11_(&local_30,lup_matrix);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const LUPMatrix& lup_matrix) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << lup_matrix.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << lup_matrix.ToLaTex();
  }

  return out;
}